

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O3

size_t FSE_readNCount_bmi2(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,
                          void *headerBuffer,size_t hbSize,int bmi2)

{
  int iVar1;
  uint *puVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint *puVar14;
  int iVar15;
  uint uVar16;
  uint *puVar17;
  bool bVar18;
  char buffer [8];
  undefined8 local_38;
  
  if (hbSize < 8) {
    local_38 = 0;
    memcpy(&local_38,headerBuffer,hbSize);
    sVar4 = FSE_readNCount_bmi2(normalizedCounter,maxSVPtr,tableLogPtr,&local_38,8,bmi2);
    sVar5 = 0xffffffffffffffec;
    if (sVar4 <= hbSize) {
      sVar5 = sVar4;
    }
    if (0xffffffffffffff88 < sVar4) {
      sVar5 = sVar4;
    }
  }
  else {
    uVar8 = *maxSVPtr + 1;
    memset(normalizedCounter,0,(ulong)uVar8 * 2);
    uVar10 = *headerBuffer & 0xf;
    sVar5 = 0xffffffffffffffd4;
    if (uVar10 < 0xb) {
      uVar7 = *headerBuffer >> 4;
      *tableLogPtr = uVar10 + 5;
      iVar15 = 0x20 << (sbyte)uVar10;
      uVar13 = iVar15 + 1;
      iVar11 = uVar10 + 6;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar17 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar18 = true;
      uVar10 = 4;
      uVar12 = 0;
      puVar14 = (uint *)headerBuffer;
      do {
        if (!bVar18) {
          uVar3 = 0;
          if ((~uVar7 | 0x80000000) != 0) {
            for (; ((~uVar7 | 0x80000000) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          while (0x17 < uVar3) {
            if (puVar2 < puVar14) {
              uVar10 = uVar10 + ((int)puVar14 - (int)puVar2) * 8 & 0x1f;
              puVar14 = puVar17;
            }
            else {
              puVar14 = (uint *)((long)puVar14 + 3);
            }
            uVar7 = *puVar14 >> (sbyte)uVar10;
            uVar3 = 0;
            if ((~uVar7 | 0x80000000) != 0) {
              for (; ((~uVar7 | 0x80000000) >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            uVar12 = uVar12 + 0x24;
          }
          uVar7 = uVar7 >> ((byte)(uVar3 & 0xfffffffe) & 0x1f) & 3;
          if (uVar7 == 3) {
            __assert_fail("(bitStream & 3) < 3",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                          ,0x6a,
                          "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                         );
          }
          uVar12 = uVar12 + (uVar3 >> 1) * 3 + uVar7;
          uVar7 = uVar10 + (uVar3 & 0xfffffffe) + 2;
          if (uVar8 <= uVar12) goto LAB_0074c149;
          if ((puVar2 < puVar14) && (puVar17 < (uint *)((long)puVar14 + (ulong)(uVar7 >> 3)))) {
            uVar10 = uVar7 + ((int)puVar14 - (int)puVar17) * 8 & 0x1f;
            puVar14 = puVar17;
          }
          else {
            if (0x1f < uVar7) {
              __assert_fail("(bitCount >> 3) <= 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                            ,0x79,
                            "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                           );
            }
            uVar10 = uVar7 & 7;
            puVar14 = (uint *)((long)puVar14 + (ulong)(uVar7 >> 3));
          }
          uVar7 = *puVar14 >> (sbyte)uVar10;
        }
        uVar3 = iVar15 * 2 - 1;
        uVar6 = uVar3 - uVar13;
        uVar16 = iVar15 - 1U & uVar7;
        if (uVar16 < uVar6) {
          iVar9 = iVar11 + -1;
        }
        else {
          uVar7 = uVar7 & uVar3;
          if ((int)uVar7 < iVar15) {
            uVar6 = 0;
          }
          uVar16 = uVar7 - uVar6;
          iVar9 = iVar11;
        }
        iVar1 = uVar16 - 1;
        if ((int)uVar16 < 1) {
          if (uVar16 != 0) {
            __assert_fail("count == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                          ,0x97,
                          "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                         );
          }
          uVar13 = uVar13 - 1;
        }
        else {
          uVar13 = uVar13 - iVar1;
        }
        normalizedCounter[uVar12] = (short)iVar1;
        bVar18 = iVar1 != 0;
        if (iVar15 < 2) {
          __assert_fail("threshold > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/common/entropy_common.c"
                        ,0x9d,
                        "size_t FSE_readNCount_body(short *, unsigned int *, unsigned int *, const void *, size_t)"
                       );
        }
        uVar7 = iVar9 + uVar10;
        uVar12 = uVar12 + 1;
        if ((int)uVar13 < iVar15) {
          if ((int)uVar13 < 2) {
LAB_0074c149:
            if (uVar13 != 1) {
              return 0xffffffffffffffec;
            }
            if (uVar8 < uVar12) {
              return 0xffffffffffffffd0;
            }
            if (0x20 < (int)uVar7) {
              return 0xffffffffffffffec;
            }
            *maxSVPtr = uVar12 - 1;
            return (long)puVar14 + ((long)((int)(uVar7 + 7) >> 3) - (long)headerBuffer);
          }
          uVar10 = 0x1f;
          if (uVar13 != 0) {
            for (; uVar13 >> uVar10 == 0; uVar10 = uVar10 - 1) {
            }
          }
          iVar11 = (uVar10 ^ 0xffffffe0) + 0x21;
          iVar15 = 1 << ((byte)uVar10 & 0x1f);
        }
        if (uVar8 <= uVar12) {
          return 0xffffffffffffffec;
        }
        if ((puVar2 < puVar14) && (puVar17 < (uint *)((long)puVar14 + (long)((int)uVar7 >> 3)))) {
          uVar10 = uVar7 + ((int)puVar14 - (int)puVar17) * 8 & 0x1f;
          puVar14 = puVar17;
        }
        else {
          uVar10 = uVar7 & 7;
          puVar14 = (uint *)((long)puVar14 + (long)((int)uVar7 >> 3));
        }
        uVar7 = *puVar14 >> (sbyte)uVar10;
      } while( true );
    }
  }
  return sVar5;
}

Assistant:

size_t FSE_readNCount_bmi2(
        short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
        const void* headerBuffer, size_t hbSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_readNCount_body_bmi2(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
    }
#endif
    (void)bmi2;
    return FSE_readNCount_body_default(normalizedCounter, maxSVPtr, tableLogPtr, headerBuffer, hbSize);
}